

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_map.cpp
# Opt level: O2

void __thiscall tst_helpers_map::modifyValues(tst_helpers_map *this)

{
  QSharedData *pQVar1;
  PromiseData<int> *this_00;
  undefined **ppuVar2;
  long lVar3;
  initializer_list<int> args;
  initializer_list<int> args_00;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_110;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_108;
  _func_int **local_100;
  QPromiseBase<int> local_f8;
  PromiseResolver<int> resolver;
  int local_dc;
  vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> promises;
  QArrayDataPointer<int> local_b0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_98;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_90;
  QArrayDataPointer<int> local_88;
  int *local_68;
  long local_60;
  long local_58;
  PromiseType p;
  int local_3c [3];
  
  local_3c[0] = 0x2a;
  local_3c[1] = 0x2b;
  local_3c[2] = 0x2c;
  args._M_len = 3;
  args._M_array = local_3c;
  QList<int>::QList((QList<int> *)&local_88,args);
  promises.super__Vector_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  promises.super__Vector_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  promises.super__Vector_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = local_88.ptr;
  local_60 = local_88.size << 2;
  ppuVar2 = &PTR__QPromiseBase_00127718;
  local_100 = (_func_int **)&PTR__QPromiseBase_00127718;
  for (lVar3 = 0; local_60 != lVar3; lVar3 = lVar3 + 4) {
    local_f8._vptr_QPromiseBase = (_func_int **)ppuVar2;
    this_00 = (PromiseData<int> *)operator_new(0x68);
    (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
    (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
    (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
    (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
    (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
    *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
    *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
    (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
    (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QtPromisePrivate::PromiseData<int>::PromiseData(this_00);
    LOCK();
    pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (this_00 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_b0.d = (Data *)&PTR__QPromiseBase_001276d0;
    local_f8.m_d.d = this_00;
    local_b0.ptr = (int *)this_00;
    QtPromisePrivate::PromiseResolver<int>::PromiseResolver
              ((PromiseResolver<int> *)&resolver.m_d,(QPromise<int> *)&local_b0);
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_b0);
    ppuVar2 = local_100;
    if (resolver.m_d.d == (Data *)0x0) {
      local_90.d = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      local_90 = resolver.m_d.d;
    }
    local_108.d = (Data *)0x0;
    if (local_90.d == (Data *)0x0) {
      local_98.d = (Data *)0x0;
    }
    else {
      LOCK();
      ((local_90.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
      ._q_value.super___atomic_base<int>._M_i =
           ((local_90.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_98.d = local_90.d;
    }
    local_110.d = (Data *)0x0;
    local_dc = *(int *)((long)local_68 + lVar3) + 1;
    local_58 = lVar3;
    QtPromisePrivate::PromiseResolver<int>::resolve<int>
              ((PromiseResolver<int> *)&local_90,&local_dc);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_98);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_110);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_90);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_108);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&resolver.m_d);
    local_f8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001276d0;
    std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>::
    emplace_back<QtPromise::QPromise<int>>
              ((vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>> *)
               &promises,(QPromise<int> *)&local_f8);
    lVar3 = local_58;
    QtPromise::QPromiseBase<int>::~QPromiseBase(&local_f8);
  }
  QtPromise::all<int,_std::vector,_std::allocator<QtPromise::QPromise<int>_>_>
            ((QtPromise *)&p,&promises);
  std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::~vector
            (&promises);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_88);
  local_88.d = (Data *)0x0;
  local_88.ptr = (int *)0x0;
  local_88.size = 0;
  waitForValue<QList<int>>((QList<int> *)&promises,&p,(QList<int> *)&local_88);
  local_f8._vptr_QPromiseBase = (_func_int **)0x2c0000002b;
  local_f8.m_d.d._0_4_ = 0x2d;
  args_00._M_len = 3;
  args_00._M_array = (iterator)&local_f8;
  QList<int>::QList((QList<int> *)&local_b0,args_00);
  QTest::qCompare<int>
            ((QList<int> *)&promises,(QList<int> *)&local_b0,"waitForValue(p, QVector<int>{})",
             "(QVector<int>{43, 44, 45})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_map.cpp"
             ,0x43);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&promises);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_88);
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase(&p.super_QPromiseBase<QList<int>_>);
  return;
}

Assistant:

void tst_helpers_map::modifyValues()
{
    auto p = QtPromise::map(QVector<int>{42, 43, 44}, [](int v, ...) {
        return v + 1;
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{43, 44, 45}));
}